

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall cnn::Model::reset_gradient(Model *this)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  
  plVar1 = *(long **)(this + 0x20);
  for (plVar3 = *(long **)(this + 0x18); plVar3 != plVar1; plVar3 = plVar3 + 1) {
    TensorTools::Zero((Tensor *)(*plVar3 + 0x78));
  }
  puVar2 = *(undefined8 **)(this + 0x38);
  for (puVar4 = *(undefined8 **)(this + 0x30); puVar4 != puVar2; puVar4 = puVar4 + 1) {
    LookupParameters::clear((LookupParameters *)*puVar4);
  }
  return;
}

Assistant:

void Model::reset_gradient() {
  for (auto p : params) { p->clear(); }
  for (auto p : lookup_params) { p->clear(); }
}